

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void ptls_log__do_push_element_hexdump(char *prefix,size_t prefix_len,void *s,size_t l)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  iVar2 = expand_logbuf_or_invalidate(prefix,prefix_len,l * 2 + 2);
  if (iVar2 != 0) {
    lVar1 = *(long *)(in_FS_OFFSET + -0xb8);
    *(long *)(in_FS_OFFSET + -0xb8) = lVar1 + 1;
    *(undefined1 *)(*(long *)(in_FS_OFFSET + -200) + lVar1) = 0x22;
    ptls_hexdump((char *)(*(long *)(in_FS_OFFSET + -200) + *(long *)(in_FS_OFFSET + -0xb8)),s,l);
    lVar1 = *(long *)(in_FS_OFFSET + -0xb8);
    *(size_t *)(in_FS_OFFSET + -0xb8) = lVar1 + l * 2 + 1;
    *(undefined1 *)(*(long *)(in_FS_OFFSET + -200) + lVar1 + l * 2) = 0x22;
  }
  return;
}

Assistant:

void ptls_log__do_push_element_hexdump(const char *prefix, size_t prefix_len, const void *s, size_t l)
{
    if (expand_logbuf_or_invalidate(prefix, prefix_len, l * 2 + 2)) {
        logbuf.buf.base[logbuf.buf.off++] = '"';
        ptls_hexdump((char *)logbuf.buf.base + logbuf.buf.off, s, l);
        logbuf.buf.off += l * 2;
        logbuf.buf.base[logbuf.buf.off++] = '"';
    }
}